

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_optimizer.c
# Opt level: O3

gravity_function_t * gravity_optimizer(gravity_function_t *f,_Bool add_debug)

{
  optag_t oVar1;
  optag_t oVar2;
  opcode_t oVar3;
  ircode_t *piVar4;
  bool bVar5;
  uint8_t uVar6;
  _Bool _Var7;
  bool bVar8;
  _Bool _Var9;
  uint16_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  inst_t *piVar15;
  inst_t *inst;
  int64_t iVar16;
  inst_t *piVar17;
  gravity_hash_t *hashtable;
  uint32_t *puVar18;
  gravity_value_t *pgVar19;
  int64_t n;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar20;
  uint uVar21;
  gravity_class_t *pgVar22;
  uint32_t i;
  optag_t oVar23;
  size_t size;
  uint32_t uVar24;
  uint32_t index;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  double dVar30;
  gravity_value_t value;
  gravity_value_t v;
  gravity_value_t key;
  gravity_value_t key_00;
  gravity_value_t key_01;
  inst_t *local_60;
  double local_58;
  uint32_t *local_50;
  int local_44;
  
  piVar4 = *(ircode_t **)((long)&f->field_9 + 0x50);
  if (piVar4 == (ircode_t *)0x0) {
    return f;
  }
  uVar11 = ircode_count(piVar4);
  uVar12 = ircode_ntemps(piVar4);
  f->ntemps = (uint16_t)uVar12;
  if (uVar11 != 0) {
LAB_00115c3e:
    uVar12 = 0;
LAB_00115c40:
    piVar15 = ircode_get(piVar4,uVar12);
    uVar24 = uVar12;
    while (piVar15 != (inst_t *)0x0) {
      uVar24 = uVar24 + 1;
      if (piVar15->tag != SKIP_TAG) {
        if ((-1 < (int)(uVar12 - 1)) && (uVar24 = uVar12, piVar15->op == NEG)) goto LAB_00115c86;
        break;
      }
      piVar15 = ircode_get(piVar4,uVar24);
    }
    goto LAB_00115cde;
  }
  goto LAB_00116359;
  while (0 < (int)uVar24) {
LAB_00115c86:
    uVar24 = uVar24 - 1;
    piVar17 = ircode_get(piVar4,uVar24);
    if ((piVar17 != (inst_t *)0x0) && (piVar17->tag != SKIP_TAG)) {
      if (((piVar17->op != LOADI) || (piVar17->p1 != piVar15->p2)) ||
         (_Var9 = ircode_register_istemp(piVar4,piVar17->p1), !_Var9)) break;
      if (piVar17->tag == DOUBLE_TAG) {
        piVar17->p1 = piVar15->p2;
        (piVar17->field_5).n = (piVar17->field_5).n ^ 0x8000000000000000;
      }
      else {
        if ((piVar17->tag != INT_TAG) || (0x20000 < (piVar17->field_5).n)) break;
        piVar17->p1 = piVar15->p2;
        (piVar17->field_5).n = -(piVar17->field_5).n;
      }
      inst_setskip(piVar15);
      goto LAB_00115c3e;
    }
  }
LAB_00115cde:
  uVar12 = uVar12 + 1;
  if (uVar12 == uVar11) goto LAB_00115d27;
  goto LAB_00115c40;
LAB_00115d27:
  uVar12 = 0;
LAB_00115d29:
  uVar24 = uVar12;
  piVar15 = ircode_get(piVar4,uVar24);
  uVar12 = uVar24;
  while (piVar15 != (inst_t *)0x0) {
    uVar12 = uVar12 + 1;
    if (piVar15->tag != SKIP_TAG) {
      if (piVar15->op - ADD < 5) {
        uVar6 = opcode_numop(piVar15->op);
        uVar12 = uVar24 - 1;
        if (uVar6 == '\x03') {
          if (-1 < (int)uVar12) {
            local_60 = (inst_t *)0x0;
            uVar12 = uVar24;
            goto LAB_00115d99;
          }
        }
        else if (-1 < (int)uVar12) goto LAB_00115de8;
      }
      break;
    }
    piVar15 = ircode_get(piVar4,uVar12);
  }
  goto LAB_00116021;
LAB_00115de8:
  piVar15 = ircode_get(piVar4,uVar12);
  if (piVar15 == (inst_t *)0x0) {
    if ((int)uVar12 < 1) goto LAB_00116021;
  }
  else if (((int)uVar12 < 1) || (piVar15->tag != SKIP_TAG)) goto LAB_00116021;
  uVar12 = uVar12 - 1;
  goto LAB_00115de8;
LAB_00115d99:
  uVar12 = uVar12 - 1;
  inst = ircode_get(piVar4,uVar12);
  piVar17 = local_60;
  if (((inst == (inst_t *)0x0) || (oVar2 = inst->tag, oVar2 == SKIP_TAG)) ||
     (piVar17 = inst, local_60 == (inst_t *)0x0)) goto LAB_00115dc2;
  if (inst->op != LOADI) goto LAB_00115f54;
  oVar3 = local_60->op;
  if (oVar3 != LOADI) {
    bVar8 = false;
    bVar5 = false;
    goto LAB_00115f60;
  }
  oVar1 = local_60->tag;
  oVar23 = DOUBLE_TAG;
  if (oVar2 == oVar1) {
    oVar23 = oVar2;
  }
  if (piVar15->p2 == inst->p1) {
    if (piVar15->p3 != local_60->p2) {
LAB_00115f54:
      bVar8 = false;
      goto LAB_00115f56;
    }
    if (oVar23 == DOUBLE_TAG) {
      if (oVar2 == INT_TAG) {
        local_58 = (double)(inst->field_5).n;
      }
      else {
        local_58 = (inst->field_5).d;
      }
      if (oVar1 == INT_TAG) {
        dVar30 = (double)(local_60->field_5).n;
      }
      else {
        dVar30 = (local_60->field_5).d;
      }
      iVar16 = 0;
      lVar25 = 0;
    }
    else {
      if (oVar2 == INT_TAG) {
        iVar16 = (inst->field_5).n;
      }
      else {
        iVar16 = (int64_t)(inst->field_5).d;
      }
      if (oVar1 == INT_TAG) {
        lVar25 = (local_60->field_5).n;
      }
      else {
        lVar25 = (long)(local_60->field_5).d;
      }
      local_58 = 0.0;
      dVar30 = 0.0;
    }
    switch(piVar15->op) {
    case ADD:
      if (oVar23 == DOUBLE_TAG) {
        local_58 = local_58 + dVar30;
        goto LAB_0011604f;
      }
      local_50 = (uint32_t *)(lVar25 + iVar16);
LAB_00116063:
      local_58 = 0.0;
      break;
    case SUB:
      if (oVar23 == DOUBLE_TAG) {
        local_58 = local_58 - dVar30;
        goto LAB_0011604f;
      }
      local_50 = (uint32_t *)(iVar16 - lVar25);
LAB_00116094:
      local_58 = 0.0;
      break;
    case DIV:
      if ((long)dVar30 == 0) goto LAB_00115f54;
      if (oVar23 != DOUBLE_TAG) {
        local_50 = (uint32_t *)(iVar16 / lVar25);
        goto LAB_00116094;
      }
      local_58 = local_58 / dVar30;
      goto LAB_0011604f;
    case MUL:
      if (oVar23 != DOUBLE_TAG) {
        local_50 = (uint32_t *)(lVar25 * iVar16);
        goto LAB_00116063;
      }
      local_58 = local_58 * dVar30;
LAB_0011604f:
      local_50 = (uint32_t *)0x0;
      break;
    case REM:
      if ((long)dVar30 == 0) goto LAB_00115f54;
      if (oVar23 == DOUBLE_TAG) {
        local_58 = (double)((long)local_58 % (long)dVar30);
        goto LAB_0011604f;
      }
      local_50 = (uint32_t *)(iVar16 % lVar25);
      local_58 = 0.0;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                    ,0x154,"_Bool optimize_const_instruction(inst_t *, inst_t *, inst_t *)");
    }
    inst_setskip(inst);
    inst_setskip(local_60);
    piVar15->op = LOADI;
    piVar15->tag = oVar23;
    piVar15->p2 = 0;
    piVar15->p3 = 0;
    if (oVar23 == DOUBLE_TAG) {
      (piVar15->field_5).d = local_58;
    }
    else {
      (piVar15->field_5).d = (double)local_50;
    }
    bVar8 = true;
LAB_00115f56:
    bVar5 = false;
  }
  else {
    bVar8 = false;
    bVar5 = false;
  }
  goto LAB_00115f5e;
LAB_00115dc2:
  local_60 = piVar17;
  if ((int)uVar12 < 1) goto code_r0x00115dc6;
  goto LAB_00115d99;
code_r0x00115dc6:
  if (local_60 == (inst_t *)0x0) goto LAB_00116021;
  bVar5 = true;
  bVar8 = false;
  inst = (inst_t *)0x0;
LAB_00115f5e:
  oVar3 = local_60->op;
LAB_00115f60:
  if (oVar3 == MOVE) {
    _Var9 = ircode_register_istemp(piVar4,piVar15->p3);
    _Var7 = ircode_register_istemp(piVar4,local_60->p1);
    if (((!_Var9) || (!_Var7)) || (piVar15->p3 != local_60->p1)) goto LAB_00115fcb;
    piVar15->p3 = local_60->p2;
    inst_setskip(local_60);
    bVar8 = true;
    uVar12 = 0;
    if (bVar5) goto LAB_00115d29;
LAB_00115fd0:
    if (inst->op == MOVE) {
      _Var9 = ircode_register_istemp(piVar4,piVar15->p2);
      _Var7 = ircode_register_istemp(piVar4,inst->p1);
      if (((_Var9) && (_Var7)) && (piVar15->p2 == inst->p1)) goto LAB_001160ec;
    }
  }
  else {
LAB_00115fcb:
    if (!bVar5) goto LAB_00115fd0;
  }
  uVar12 = 0;
  if (bVar8) goto LAB_00115d29;
LAB_00116021:
  uVar12 = uVar24 + 1;
  if (uVar24 + 1 == uVar11) {
    uVar12 = 0;
    bVar8 = true;
    goto LAB_00116108;
  }
  goto LAB_00115d29;
LAB_001160ec:
  piVar15->p2 = inst->p2;
  inst_setskip(inst);
  goto LAB_00115d27;
LAB_00116108:
  piVar15 = ircode_get(piVar4,uVar12);
  uVar24 = uVar12;
  while (piVar15 != (inst_t *)0x0) {
    uVar24 = uVar24 + 1;
    if (piVar15->tag != SKIP_TAG) {
      if (piVar15->tag == PRAGMA_MOVE_OPTIMIZATION) {
        if (piVar15->p1 == 0) {
LAB_00116191:
          bVar8 = false;
          break;
        }
      }
      else if (!bVar8) goto LAB_00116191;
      if ((int)(uVar12 - 1) < 0) {
        bVar8 = true;
      }
      else {
        bVar5 = true;
        uVar24 = uVar12;
        bVar8 = true;
        if (piVar15->op == MOVE) goto LAB_0011616a;
      }
      break;
    }
    piVar15 = ircode_get(piVar4,uVar24);
  }
  goto LAB_001161fc;
  while (0 < (int)uVar24) {
LAB_0011616a:
    uVar24 = uVar24 - 1;
    piVar17 = ircode_get(piVar4,uVar24);
    bVar8 = bVar5;
    if ((piVar17 != (inst_t *)0x0) && (piVar17->tag != SKIP_TAG)) {
      if (piVar17->op - LOADK < 3) {
        _Var9 = ircode_register_istemp(piVar4,piVar15->p2);
        _Var7 = ircode_register_istemp(piVar4,piVar17->p1);
        if (((_Var9) && (_Var7)) && (piVar15->p2 == piVar17->p1)) {
          piVar17->p1 = piVar15->p1;
          inst_setskip(piVar15);
          bVar8 = true;
          uVar12 = 0;
          goto LAB_00116108;
        }
      }
      break;
    }
  }
LAB_001161fc:
  uVar12 = uVar12 + 1;
  if (uVar12 == uVar11) goto LAB_00116207;
  goto LAB_00116108;
LAB_00116207:
  uVar12 = 0;
LAB_00116209:
  piVar15 = ircode_get(piVar4,uVar12);
  uVar24 = uVar12;
  while (piVar15 != (inst_t *)0x0) {
    uVar24 = uVar24 + 1;
    if (piVar15->tag != SKIP_TAG) {
      if (piVar15->op == RET) {
        uVar24 = uVar12;
        if (-1 < (int)(uVar12 - 1)) goto LAB_0011624b;
        goto LAB_00116269;
      }
      break;
    }
    piVar15 = ircode_get(piVar4,uVar24);
  }
  goto LAB_00116294;
  while (0 < (int)uVar24) {
LAB_0011624b:
    uVar24 = uVar24 - 1;
    piVar17 = ircode_get(piVar4,uVar24);
    if ((piVar17 != (inst_t *)0x0) && (piVar17->tag != SKIP_TAG)) goto LAB_0011626c;
  }
LAB_00116269:
  piVar17 = (inst_t *)0x0;
LAB_0011626c:
  _Var9 = ircode_register_istemp(piVar4,piVar15->p1);
  if (((piVar17 != (inst_t *)0x0) && (_Var9)) &&
     ((piVar17->op == MOVE && (piVar15->p1 == piVar17->p1)))) goto LAB_001162a1;
LAB_00116294:
  uVar12 = uVar12 + 1;
  if (uVar12 == uVar11) {
    uVar12 = 0;
    uVar24 = 1;
    goto LAB_001162bf;
  }
  goto LAB_00116209;
LAB_001162a1:
  piVar15->p1 = piVar17->p2;
  inst_setskip(piVar17);
  goto LAB_00116207;
LAB_001162bf:
  do {
    piVar15 = ircode_get(piVar4,uVar12);
    index = uVar24;
    while (piVar15 != (inst_t *)0x0) {
      oVar2 = piVar15->tag;
      if (oVar2 != SKIP_TAG) {
        if (piVar15->op != LOADI) break;
        if (oVar2 == DOUBLE_TAG) {
          aVar20 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar15->field_5).n;
          pgVar22 = gravity_class_float;
        }
        else if ((oVar2 != INT_TAG) ||
                (aVar20 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar15->field_5).n,
                pgVar22 = gravity_class_int, 0xfffffffffffbffff < aVar20.n - 0x20001U)) break;
        v.field_1.n = aVar20.n;
        v.isa = pgVar22;
        uVar10 = gravity_function_cpool_add((gravity_vm *)0x0,f,v);
        piVar15->op = LOADK;
        piVar15->tag = NO_TAG;
        piVar15->p2 = (uint)uVar10;
        break;
      }
      piVar15 = ircode_get(piVar4,index);
      index = index + 1;
    }
    uVar12 = uVar12 + 1;
    uVar24 = uVar24 + 1;
  } while (uVar12 != uVar11);
LAB_00116359:
  piVar4 = (ircode_t *)(f->field_9).field_0.bytecode;
  uVar11 = ircode_count(piVar4);
  uVar26 = 0;
  hashtable = gravity_hash_create(0,hash_compute,hash_isequal,(gravity_hash_iterate_fn)0x0,
                                  (void *)0x0);
  if (uVar11 != 0) {
    aVar20.n = 0;
    uVar12 = 0;
    do {
      piVar15 = ircode_get(piVar4,uVar12);
      oVar2 = piVar15->tag;
      if ((oVar2 != PRAGMA_MOVE_OPTIMIZATION) && (oVar2 != SKIP_TAG)) {
        if (oVar2 == LABEL_TAG) {
          key.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar15->p1;
          value.field_1.n = aVar20.n;
          value.isa = gravity_class_int;
          key.isa = gravity_class_int;
          gravity_hash_insert(hashtable,key,value);
        }
        else {
          aVar20._0_4_ = (int)aVar20.n + 1;
          aVar20.n._4_4_ = 0;
        }
      }
      uVar26 = (uint)aVar20.n;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  (f->field_9).field_0.ninsts = uVar26;
  size = (ulong)(uVar26 + 1) << 2;
  local_50 = (uint32_t *)0x0;
  puVar18 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
  if (add_debug) {
    local_50 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
  }
  if (puVar18 == (uint32_t *)0x0) {
    __assert_fail("bytecode",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                  ,0x4d,"void finalize_function(gravity_function_t *, _Bool)");
  }
  if (uVar11 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = 0;
    uVar12 = 0;
    uVar27 = 0;
    do {
      piVar15 = ircode_get(piVar4,uVar12);
      oVar2 = piVar15->tag;
      if ((oVar2 < 8) && (uVar28 = uVar27, (0x98U >> (oVar2 & 0x1f) & 1) != 0)) goto LAB_0011666a;
      oVar3 = piVar15->op;
      switch(oVar3) {
      case RET0:
      case HALT:
      case NOP:
        uVar14 = oVar3 << 0x1a;
        break;
      case RET:
        uVar14 = (piVar15->p1 & 0xffU) << 0x12 | 0xc000000;
        break;
      case CALL:
        uVar14 = (piVar15->p3 & 0x3ffU) +
                 ((piVar15->p2 & 0xffU) << 10 | (piVar15->p1 & 0xffU) << 0x12) + 0x10000000;
        break;
      case LOAD:
      case STORE:
        local_44 = local_44 + 1;
      case LOADS:
      case LOADAT:
      case STOREAT:
      case ADD:
      case SUB:
      case DIV:
      case MUL:
      case REM:
      case AND:
      case OR:
      case LT:
      case GT:
      case EQ:
      case LEQ:
      case GEQ:
      case NEQ:
      case EQQ:
      case NEQQ:
      case ISA:
      case MATCH:
      case NEG:
      case NOT:
      case LSHIFT:
      case RSHIFT:
      case BAND:
      case BOR:
      case BXOR:
      case BNOT:
        uVar14 = piVar15->p3 & 0x3ffU |
                 (piVar15->p2 & 0xffU) << 10 | (piVar15->p1 & 0xffU) << 0x12 | oVar3 << 0x1a;
        break;
      case LOADG:
      case LOADU:
      case STOREG:
      case STOREU:
        local_44 = local_44 + 1;
      case LOADK:
      case MOVE:
      case MAPNEW:
      case LISTNEW:
      case CLOSURE:
      case CLOSE:
        uVar14 = (piVar15->p1 & 0xffU) << 0x12 | oVar3 << 0x1a;
        uVar13 = piVar15->p2;
        uVar21 = 0x3ffff;
        goto LAB_001164d6;
      case LOADI:
        uVar14 = ((uint)((ulong)(piVar15->field_5).n >> 0x2e) & 0x20000) +
                 ((uint)(piVar15->field_5).n & 0x1ffff | (piVar15->p1 & 0xffU) << 0x12) + 0x28000000
        ;
        break;
      case JUMP:
        key_00.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar15->p1;
        key_00.isa = gravity_class_int;
        pgVar19 = gravity_hash_lookup(hashtable,key_00);
        if (pgVar19 == (gravity_value_t *)0x0) {
          __assert_fail("v",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                        ,0x94,"void finalize_function(gravity_function_t *, _Bool)");
        }
        uVar14 = piVar15->op << 0x1a;
        uVar13 = *(uint *)&pgVar19->field_1;
        uVar21 = 0x3ffffff;
        goto LAB_001164d6;
      case JUMPF:
        key_01.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar15->p2;
        key_01.isa = gravity_class_int;
        pgVar19 = gravity_hash_lookup(hashtable,key_01);
        if (pgVar19 == (gravity_value_t *)0x0) {
          __assert_fail("v",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                        ,0x86,"void finalize_function(gravity_function_t *, _Bool)");
        }
        uVar14 = (piVar15->p3 & 1U) << 0x11 | (piVar15->p1 & 0xffU) << 0x12 | piVar15->op << 0x1a;
        uVar13 = *(uint *)&pgVar19->field_1;
        uVar21 = 0x1ffff;
LAB_001164d6:
        uVar14 = uVar13 & uVar21 | uVar14;
        break;
      case SWITCH:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                      ,0xbb,"void finalize_function(gravity_function_t *, _Bool)");
      case RANGENEW:
        uVar14 = ((uint)(oVar2 != RANGE_INCLUDE_TAG) | (piVar15->p1 & 0xffU) << 0x12 |
                 (piVar15->p2 & 0xffU) << 10) + (piVar15->p3 & 0xffU) * 4 + 0xbc000000;
        break;
      case SETLIST:
        uVar14 = (piVar15->p3 & 0x3ffU) +
                 ((piVar15->p2 & 0xffU) << 10 | (piVar15->p1 & 0xffU) << 0x12) + 0xc0000000;
        break;
      case CHECK:
        uVar14 = (piVar15->p1 & 0xffU) * 0x40000 + (piVar15->p2 & 0x3ffffU) + 0xcc000000;
        break;
      case RESERVED2:
      case RESERVED3:
      case RESERVED4:
      case RESERVED5:
      case RESERVED6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                      ,0xcc,"void finalize_function(gravity_function_t *, _Bool)");
      default:
        uVar14 = 0;
      }
      if (add_debug) {
        local_50[uVar27] = piVar15->lineno;
      }
      uVar28 = (ulong)((int)uVar27 + 1);
      puVar18[uVar27] = uVar14;
LAB_0011666a:
      uVar12 = uVar12 + 1;
      uVar27 = uVar28;
    } while (uVar11 != uVar12);
  }
  ircode_free(piVar4);
  gravity_hash_free(hashtable);
  (f->field_9).field_0.bytecode = puVar18;
  (f->field_9).field_0.lineno = local_50;
  if (local_44 == 0) {
    fVar29 = 1.0;
  }
  else {
    fVar29 = ((float)(uint)(local_44 * 100) / (float)uVar26) / 100.0;
  }
  (f->field_9).field_0.purity = fVar29;
  return f;
}

Assistant:

gravity_function_t *gravity_optimizer(gravity_function_t *f, bool add_debug) {
    if (f->bytecode == NULL) return f;

    ircode_t    *code = (ircode_t *)f->bytecode;
    uint32_t    count = ircode_count(code);
    bool        optimizer = true;

    f->ntemps = ircode_ntemps(code);

    loop_neg:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NEG(inst)) {
            bool b = optimize_neg_instruction (code, inst, i);
            if (b) goto loop_neg;
        }
    }

    loop_math:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_MATH(inst)) {
            bool b = optimize_math_instruction (code, inst, i);
            if (b) goto loop_math;
        }
    }

    loop_move:
    optimizer = true;
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_PRAGMA_MOVE_OPT(inst)) optimizer = (bool)inst->p1;
        if (optimizer && IS_MOVE(inst)) {
            bool b = optimize_move_instruction (code, inst, i);
            if (b) goto loop_move;
        }
    }

    loop_ret:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_RET(inst)) {
            bool b = optimize_return_instruction (code, inst, i);
            if (b) goto loop_ret;
        }
    }

    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NUM(inst)) optimize_num_instruction (inst, f);
    }

    // dump optimized version
    #if GRAVITY_BYTECODE_DEBUG
    gravity_function_dump(f, ircode_dump);
    #endif

    // finalize function
	finalize_function(f, add_debug);

    return f;
}